

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alignment_engine.cpp
# Opt level: O1

unique_ptr<spoa::AlignmentEngine,_std::default_delete<spoa::AlignmentEngine>_> __thiscall
spoa::AlignmentEngine::Create
          (AlignmentEngine *this,AlignmentType type,int8_t m,int8_t n,int8_t g,int8_t e,int8_t q,
          int8_t c)

{
  invalid_argument *this_00;
  int8_t e_00;
  AlignmentSubtype subtype;
  unique_ptr<spoa::AlignmentEngine,_std::default_delete<spoa::AlignmentEngine>_> dst;
  
  if (type < (kOV|kNW)) {
    if ((g < '\x01') && (q < '\x01')) {
      if ((e < '\x01') && (c < '\x01')) {
        subtype = kLinear;
        if (g < e) {
          subtype = kConvex - (c <= e || g <= q);
        }
        e_00 = g;
        if ((subtype != kLinear) && (e_00 = e, subtype == kAffine)) {
          c = e;
          q = g;
        }
        CreateSimdAlignmentEngine((spoa *)&dst,type,subtype,m,n,g,e_00,q,c);
        if ((__uniq_ptr_impl<spoa::AlignmentEngine,_std::default_delete<spoa::AlignmentEngine>_>)
            dst._M_t.
            super___uniq_ptr_impl<spoa::AlignmentEngine,_std::default_delete<spoa::AlignmentEngine>_>
            ._M_t.
            super__Tuple_impl<0UL,_spoa::AlignmentEngine_*,_std::default_delete<spoa::AlignmentEngine>_>
            .super__Head_base<0UL,_spoa::AlignmentEngine_*,_false>._M_head_impl ==
            (__uniq_ptr_impl<spoa::AlignmentEngine,_std::default_delete<spoa::AlignmentEngine>_>)0x0
           ) {
          SisdAlignmentEngine::Create((SisdAlignmentEngine *)this,type,subtype,m,n,g,e_00,q,c);
        }
        else {
          this->_vptr_AlignmentEngine =
               (_func_int **)
               dst._M_t.
               super___uniq_ptr_impl<spoa::AlignmentEngine,_std::default_delete<spoa::AlignmentEngine>_>
               ._M_t.
               super__Tuple_impl<0UL,_spoa::AlignmentEngine_*,_std::default_delete<spoa::AlignmentEngine>_>
               .super__Head_base<0UL,_spoa::AlignmentEngine_*,_false>._M_head_impl;
          dst._M_t.
          super___uniq_ptr_impl<spoa::AlignmentEngine,_std::default_delete<spoa::AlignmentEngine>_>.
          _M_t.
          super__Tuple_impl<0UL,_spoa::AlignmentEngine_*,_std::default_delete<spoa::AlignmentEngine>_>
          .super__Head_base<0UL,_spoa::AlignmentEngine_*,_false>._M_head_impl =
               (__uniq_ptr_data<spoa::AlignmentEngine,_std::default_delete<spoa::AlignmentEngine>,_true,_true>
                )(__uniq_ptr_impl<spoa::AlignmentEngine,_std::default_delete<spoa::AlignmentEngine>_>
                  )0x0;
        }
        if ((__uniq_ptr_impl<spoa::AlignmentEngine,_std::default_delete<spoa::AlignmentEngine>_>)
            dst._M_t.
            super___uniq_ptr_impl<spoa::AlignmentEngine,_std::default_delete<spoa::AlignmentEngine>_>
            ._M_t.
            super__Tuple_impl<0UL,_spoa::AlignmentEngine_*,_std::default_delete<spoa::AlignmentEngine>_>
            .super__Head_base<0UL,_spoa::AlignmentEngine_*,_false>._M_head_impl !=
            (__uniq_ptr_impl<spoa::AlignmentEngine,_std::default_delete<spoa::AlignmentEngine>_>)0x0
           ) {
          (**(code **)(*(long *)dst._M_t.
                                super___uniq_ptr_impl<spoa::AlignmentEngine,_std::default_delete<spoa::AlignmentEngine>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_spoa::AlignmentEngine_*,_std::default_delete<spoa::AlignmentEngine>_>
                                .super__Head_base<0UL,_spoa::AlignmentEngine_*,_false>._M_head_impl
                      + 8))();
        }
        return (__uniq_ptr_data<spoa::AlignmentEngine,_std::default_delete<spoa::AlignmentEngine>,_true,_true>
                )(__uniq_ptr_data<spoa::AlignmentEngine,_std::default_delete<spoa::AlignmentEngine>,_true,_true>
                  )this;
      }
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument
                (this_00,
                 "[spoa::AlignmentEngine::Create] error: gap extension penalty must be non-positive!"
                );
    }
    else {
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument
                (this_00,
                 "[spoa::AlignmentEngine::Create] error: gap opening penalty must be non-positive!")
      ;
    }
  }
  else {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (this_00,"[spoa::AlignmentEngine::Create] error: invalid alignment type!");
  }
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

std::unique_ptr<AlignmentEngine> AlignmentEngine::Create(
    AlignmentType type,
    std::int8_t m,
    std::int8_t n,
    std::int8_t g,
    std::int8_t e,
    std::int8_t q,
    std::int8_t c) {
  if (type != AlignmentType::kSW &&
      type != AlignmentType::kNW &&
      type != AlignmentType::kOV) {
    throw std::invalid_argument(
        "[spoa::AlignmentEngine::Create] error: invalid alignment type!");
  }
  if (g > 0 || q > 0) {
    throw std::invalid_argument(
        "[spoa::AlignmentEngine::Create] error: "
        "gap opening penalty must be non-positive!");
  }
  if (e > 0 || c > 0) {
    throw std::invalid_argument(
        "[spoa::AlignmentEngine::Create] error: "
        "gap extension penalty must be non-positive!");
  }

  AlignmentSubtype subtype = g >= e ?
      AlignmentSubtype::kLinear : (g <= q || e >= c ?
      AlignmentSubtype::kAffine : AlignmentSubtype::kConvex);

  if (subtype == AlignmentSubtype::kLinear) {
    e = g;
  } else if (subtype == AlignmentSubtype::kAffine) {
    q = g;
    c = e;
  }

  auto dst = CreateSimdAlignmentEngine(type, subtype, m, n, g, e, q, c);
  if (!dst) {
    return SisdAlignmentEngine::Create(type, subtype, m, n, g, e, q, c);
  }
  return dst;
}